

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffpxsz(int datatype)

{
  if (datatype < 0x1f) {
    if (datatype < 0x14) {
      if ((datatype == 0xb) || (datatype == 0xe)) {
        return 1;
      }
    }
    else {
      if ((datatype == 0x14) || (datatype == 0x15)) {
        return 2;
      }
      if (datatype == 0x1e) {
        return 4;
      }
    }
    return 0;
  }
  if (datatype < 0x29) {
    if (datatype == 0x1f) {
      return 4;
    }
    if (datatype != 0x28) {
      return 0;
    }
  }
  else if (datatype != 0x29) {
    if (datatype == 0x2a) {
      return 4;
    }
    if (datatype != 0x52) {
      return 0;
    }
  }
  return 8;
}

Assistant:

int ffpxsz(int datatype)
/*
   return the number of bytes per pixel associated with the datatype
*/
{
    if (datatype == TBYTE)
       return(sizeof(char));
    else if (datatype == TUSHORT)
       return(sizeof(short));
    else if (datatype == TSHORT)
       return(sizeof(short));
    else if (datatype == TULONG)
       return(sizeof(long));
    else if (datatype == TLONG)
       return(sizeof(long));
    else if (datatype == TINT)
       return(sizeof(int));
    else if (datatype == TUINT)
       return(sizeof(int));
    else if (datatype == TFLOAT)
       return(sizeof(float));
    else if (datatype == TDOUBLE)
       return(sizeof(double));
    else if (datatype == TLOGICAL)
       return(sizeof(char));
    else
       return(0);
}